

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
ManchesterAnalyzerSettings::ManchesterAnalyzerSettings(ManchesterAnalyzerSettings *this)

{
  AnalyzerSettingInterfaceChannel *this_00;
  element_type *peVar1;
  AnalyzerSettingInterfaceNumberList *pAVar2;
  element_type *peVar3;
  AnalyzerSettingInterfaceInteger *pAVar4;
  element_type *peVar5;
  ostream *poVar6;
  ulong uVar7;
  Channel *pCVar8;
  char *pcVar9;
  uint uVar10;
  string local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  uint local_20;
  U32 i;
  ManchesterAnalyzerSettings *local_10;
  ManchesterAnalyzerSettings *this_local;
  
  local_10 = this;
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__ManchesterAnalyzerSettings_00115d68;
  Channel::Channel(&this->mInputChannel,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mMode = MANCHESTER;
  this->mBitRate = 0x5dc;
  this->mInverted = false;
  this->mBitsPerTransfer = 8;
  this->mShiftOrder = LsbFirst;
  this->mBitsToIgnore = 0;
  this->mTolerance = TOL25;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::auto_ptr
            (&this->mInputChannelInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mModeInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::auto_ptr
            (&this->mBitRateInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mInvertedInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mBitsPerTransferInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mShiftOrderInterface,(element_type *)0x0);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::auto_ptr
            (&this->mNumBitsIgnoreInterface,(element_type *)0x0);
  uVar7 = 0;
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::auto_ptr
            (&this->mToleranceInterface,(element_type *)0x0);
  this_00 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar7);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_00);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(&this->mInputChannelInterface,this_00);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mInputChannelInterface)
  ;
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar1,"Manchester");
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mInputChannelInterface)
  ;
  pCVar8 = &this->mInputChannel;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar8);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mModeInterface,pAVar2);
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mModeInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar3,"Mode");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mModeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar3,"Manchester");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mModeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar3,"Differential Manchester");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mModeInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)peVar3,"Bi-Phase Mark Code (FM1)");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mModeInterface);
  pcVar9 = "Bi-Phase Space Code (FM0)";
  AnalyzerSettingInterfaceNumberList::AddNumber(3.0,(char *)peVar3,"Bi-Phase Space Code (FM0)");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mModeInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mMode);
  pAVar4 = (AnalyzerSettingInterfaceInteger *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar9);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(pAVar4);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::reset(&this->mBitRateInterface,pAVar4);
  peVar5 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar5,"Bit Rate (Bits/s)");
  peVar5 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterfaceInteger::SetMax((int)peVar5);
  peVar5 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  AnalyzerSettingInterfaceInteger::SetMin((int)peVar5);
  peVar5 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->(&this->mBitRateInterface);
  uVar7 = (ulong)this->mBitRate;
  AnalyzerSettingInterfaceInteger::SetInteger((int)peVar5);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mInvertedInterface,pAVar2);
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mInvertedInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar3,"Edge Polarity");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mInvertedInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar3,"negative edge is binary one");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mInvertedInterface);
  pcVar9 = "negative edge is binary zero";
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar3,"negative edge is binary zero");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mInvertedInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)(this->mInverted & 1));
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar9);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mBitsPerTransferInterface,pAVar2);
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mBitsPerTransferInterface);
  pcVar9 = "Bits Per Frame";
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar3,"Bits Per Frame");
  for (local_20 = 1; local_20 < 0x41; local_20 = local_20 + 1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    if (local_20 == 1) {
      std::operator<<(local_198,"1 Bit per Transfer");
    }
    else {
      poVar6 = (ostream *)std::ostream::operator<<(local_198,local_20);
      std::operator<<(poVar6," Bits per Transfer");
    }
    peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                       (&this->mBitsPerTransferInterface);
    uVar7 = (ulong)local_20;
    std::__cxx11::stringstream::str();
    pcVar9 = (char *)std::__cxx11::string::c_str();
    AnalyzerSettingInterfaceNumberList::AddNumber((double)uVar7,(char *)peVar3,pcVar9);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mBitsPerTransferInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mBitsPerTransfer);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar9);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mShiftOrderInterface,pAVar2);
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mShiftOrderInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar3,"Significant Bit");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mShiftOrderInterface);
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)peVar3,"Least Significant Bit Sent First");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->
                     (&this->mShiftOrderInterface);
  pcVar9 = "Most Significant Bit Sent First";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)peVar3,"Most Significant Bit Sent First");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mShiftOrderInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mShiftOrder);
  pAVar4 = (AnalyzerSettingInterfaceInteger *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar9);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(pAVar4);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::reset(&this->mNumBitsIgnoreInterface,pAVar4);
  peVar5 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->
                     (&this->mNumBitsIgnoreInterface);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar5,"Preamble bits to ignore");
  peVar5 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->
                     (&this->mNumBitsIgnoreInterface);
  AnalyzerSettingInterfaceInteger::SetMax((int)peVar5);
  peVar5 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->
                     (&this->mNumBitsIgnoreInterface);
  AnalyzerSettingInterfaceInteger::SetMin((int)peVar5);
  peVar5 = std::auto_ptr<AnalyzerSettingInterfaceInteger>::operator->
                     (&this->mNumBitsIgnoreInterface);
  uVar7 = (ulong)this->mBitsToIgnore;
  AnalyzerSettingInterfaceInteger::SetInteger((int)peVar5);
  pAVar2 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar7);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar2);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(&this->mToleranceInterface,pAVar2);
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mToleranceInterface)
  ;
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)peVar3,"Tolerance");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mToleranceInterface)
  ;
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)peVar3,"25% of period (default)");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mToleranceInterface)
  ;
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)peVar3,"5% of period");
  peVar3 = std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mToleranceInterface)
  ;
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)peVar3,"0.5% of period");
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mToleranceInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mTolerance);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::get(&this->mInputChannelInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mModeInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::get(&this->mBitRateInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mInvertedInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mBitsPerTransferInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mShiftOrderInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::get(&this->mNumBitsIgnoreInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::get(&this->mToleranceInterface);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar10 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar10,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar10,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar10,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  return;
}

Assistant:

ManchesterAnalyzerSettings::ManchesterAnalyzerSettings()
    : mInputChannel( UNDEFINED_CHANNEL ),
      mMode( MANCHESTER ),
      mBitRate( 1500 ),
      mInverted( false ),
      mBitsPerTransfer( 8 ),
      mShiftOrder( AnalyzerEnums::LsbFirst ),
      mBitsToIgnore( 0 ),
      mTolerance( TOL25 )
{
    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "Manchester", "Manchester" );
    mInputChannelInterface->SetChannel( mInputChannel );

    mModeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mModeInterface->SetTitleAndTooltip( "Mode", "Specify the Manchester Mode" );
    mModeInterface->AddNumber( MANCHESTER, "Manchester", "" );
    mModeInterface->AddNumber( DIFFERENTIAL_MANCHESTER, "Differential Manchester", "" );
    mModeInterface->AddNumber( BI_PHASE_MARK, "Bi-Phase Mark Code (FM1)", "" );
    mModeInterface->AddNumber( BI_PHASE_SPACE, "Bi-Phase Space Code (FM0)", "" );
    mModeInterface->SetNumber( mMode );

    mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mBitRateInterface->SetTitleAndTooltip( "Bit Rate (Bits/s)", "Specify the bit rate in bits per second." );
    mBitRateInterface->SetMax( 100000000 );
    mBitRateInterface->SetMin( 1 );
    mBitRateInterface->SetInteger( mBitRate );

    mInvertedInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mInvertedInterface->SetTitleAndTooltip( "Edge Polarity", "Specify the Manchester edge polarity (Normal Manchester mode only)" );
    mInvertedInterface->AddNumber( false, "negative edge is binary one", "" );
    mInvertedInterface->AddNumber( true, "negative edge is binary zero", "" );
    mInvertedInterface->SetNumber( mInverted );

    mBitsPerTransferInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mBitsPerTransferInterface->SetTitleAndTooltip( "Bits Per Frame", "Select the number of bits per frame" );
    for( U32 i = 1; i <= 64; i++ )
    {
        std::stringstream ss;

        if( i == 1 )
            ss << "1 Bit per Transfer";
        else
            ss << i << " Bits per Transfer";

        mBitsPerTransferInterface->AddNumber( i, ss.str().c_str(), "" );
    }
    mBitsPerTransferInterface->SetNumber( mBitsPerTransfer );

    mShiftOrderInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mShiftOrderInterface->SetTitleAndTooltip( "Significant Bit",
                                              "Select if the most significant bit or least significant bit is transmitted first" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::LsbFirst, "Least Significant Bit Sent First", "" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::MsbFirst, "Most Significant Bit Sent First", "" );
    mShiftOrderInterface->SetNumber( mShiftOrder );


    mNumBitsIgnoreInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mNumBitsIgnoreInterface->SetTitleAndTooltip( "Preamble bits to ignore", "Specify the number of preamble bits to ignore." );
    mNumBitsIgnoreInterface->SetMax( 1000 );
    mNumBitsIgnoreInterface->SetMin( 0 );
    mNumBitsIgnoreInterface->SetInteger( mBitsToIgnore );

    mToleranceInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mToleranceInterface->SetTitleAndTooltip( "Tolerance", "Specify the Manchester Tolerance as a percentage of period" );
    mToleranceInterface->AddNumber( TOL25, "25% of period (default)", "Maximum allowed tolerance, +- 50% of one half period" );
    mToleranceInterface->AddNumber( TOL5, "5% of period", "Required more than 10x over sampling" );
    mToleranceInterface->AddNumber( TOL05, "0.5% of period", "Requires more than 200x over sampling" );
    mToleranceInterface->SetNumber( mTolerance );

    AddInterface( mInputChannelInterface.get() );
    AddInterface( mModeInterface.get() );
    AddInterface( mBitRateInterface.get() );
    AddInterface( mInvertedInterface.get() );
    AddInterface( mBitsPerTransferInterface.get() );
    AddInterface( mShiftOrderInterface.get() );
    AddInterface( mNumBitsIgnoreInterface.get() );
    AddInterface( mToleranceInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "Manchester", false );
}